

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_zstd.c
# Opt level: O0

int drive_compressor(archive_write_filter *f,private_data_conflict9 *data,int flush,void *src,
                    size_t length)

{
  anon_enum_32 aVar1;
  size_t sVar2;
  archive *a;
  size_t sVar3;
  int iVar4;
  undefined8 uVar5;
  long lStack_68;
  int ret;
  size_t zstdret;
  size_t opos;
  size_t ipos;
  ZSTD_inBuffer in;
  size_t length_local;
  void *src_local;
  int flush_local;
  private_data_conflict9 *data_local;
  archive_write_filter *f_local;
  
  in.size = 0;
  ipos = (size_t)src;
  in.src = (void *)length;
  in.pos = length;
  do {
    sVar3 = in.size;
    sVar2 = (data->out).pos;
    aVar1 = data->state;
    if (aVar1 == running) {
      if ((void *)in.size == in.src) {
        return 0;
      }
      lStack_68 = ZSTD_compressStream(data->cstream,&data->out,&ipos);
      iVar4 = ZSTD_isError(lStack_68);
      if (iVar4 != 0) {
LAB_0019d961:
        a = f->archive;
        uVar5 = ZSTD_getErrorName(lStack_68);
        archive_set_error(a,-1,"Zstd compression failed: %s",uVar5);
        return -0x1e;
      }
    }
    else if (aVar1 == finishing) {
      lStack_68 = ZSTD_endStream(data->cstream,&data->out);
      iVar4 = ZSTD_isError(lStack_68);
      if (iVar4 != 0) goto LAB_0019d961;
      if (lStack_68 == 0) {
        data->state = resetting;
      }
    }
    else if (aVar1 == resetting) {
      ZSTD_CCtx_reset(data->cstream,1);
      data->cur_frame = data->cur_frame + 1;
      data->cur_frame_in = 0;
      data->cur_frame_out = 0;
      data->state = running;
    }
    data->total_in = (in.size - sVar3) + data->total_in;
    data->cur_frame_in = (in.size - sVar3) + data->cur_frame_in;
    data->cur_frame_out = ((data->out).pos - sVar2) + data->cur_frame_out;
    if ((data->state == running) &&
       ((data->max_frame_in <= data->cur_frame_in || (data->max_frame_out <= data->cur_frame_out))))
    {
      data->state = finishing;
    }
    if (((data->out).pos == (data->out).size) || ((flush != 0 && ((data->out).pos != 0)))) {
      iVar4 = __archive_write_filter(f->next_filter,(data->out).dst,(data->out).pos);
      if (iVar4 != 0) {
        return -0x1e;
      }
      (data->out).pos = 0;
    }
  } while( true );
}

Assistant:

static int
drive_compressor(struct archive_write_filter *f,
    struct private_data *data, int flush, const void *src, size_t length)
{
	ZSTD_inBuffer in = { .src = src, .size = length, .pos = 0 };
	size_t ipos, opos, zstdret = 0;
	int ret;

	for (;;) {
		ipos = in.pos;
		opos = data->out.pos;
		switch (data->state) {
		case running:
			if (in.pos == in.size)
				return (ARCHIVE_OK);
			zstdret = ZSTD_compressStream(data->cstream,
			    &data->out, &in);
			if (ZSTD_isError(zstdret))
				goto zstd_fatal;
			break;
		case finishing:
			zstdret = ZSTD_endStream(data->cstream, &data->out);
			if (ZSTD_isError(zstdret))
				goto zstd_fatal;
			if (zstdret == 0)
				data->state = resetting;
			break;
		case resetting:
			ZSTD_CCtx_reset(data->cstream, ZSTD_reset_session_only);
			data->cur_frame++;
			data->cur_frame_in = 0;
			data->cur_frame_out = 0;
			data->state = running;
			break;
		}
		data->total_in += in.pos - ipos;
		data->cur_frame_in += in.pos - ipos;
		data->cur_frame_out += data->out.pos - opos;
		if (data->state == running) {
			if (data->cur_frame_in >= data->max_frame_in ||
			    data->cur_frame_out >= data->max_frame_out) {
				data->state = finishing;
			}
		}
		if (data->out.pos == data->out.size ||
		    (flush && data->out.pos > 0)) {
			ret = __archive_write_filter(f->next_filter,
			    data->out.dst, data->out.pos);
			if (ret != ARCHIVE_OK)
				goto fatal;
			data->out.pos = 0;
		}
	}
zstd_fatal:
	archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
	    "Zstd compression failed: %s",
	    ZSTD_getErrorName(zstdret));
fatal:
	return (ARCHIVE_FATAL);
}